

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMStateSet.hpp
# Opt level: O3

bool __thiscall xercesc_4_0::CMStateSet::operator==(CMStateSet *this,CMStateSet *setToCompare)

{
  CMDynamicBuffer *pCVar1;
  XMLInt32 *pXVar2;
  XMLSize_t XVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  
  if (this->fBitCount == setToCompare->fBitCount) {
    pCVar1 = this->fDynamicBuffer;
    if (pCVar1 == (CMDynamicBuffer *)0x0) {
      lVar4 = 0;
      do {
        bVar5 = this->fBits[lVar4] == setToCompare->fBits[lVar4];
        if (!bVar5) {
          return bVar5;
        }
        bVar6 = lVar4 != 3;
        lVar4 = lVar4 + 1;
      } while (bVar6);
    }
    else {
      bVar5 = true;
      if (pCVar1->fArraySize != 0) {
        XVar3 = 0;
        do {
          pXVar2 = setToCompare->fDynamicBuffer->fBitArray[XVar3];
          if (pCVar1->fBitArray[XVar3] == (XMLInt32 *)0x0) {
            if (pXVar2 != (XMLInt32 *)0x0) goto LAB_002ea3ce;
          }
          else {
            if (pXVar2 == (XMLInt32 *)0x0) goto LAB_002ea3ce;
            lVar4 = 0;
            do {
              if (pCVar1->fBitArray[XVar3][lVar4] != pXVar2[lVar4]) goto LAB_002ea3ce;
              lVar4 = lVar4 + 1;
            } while (lVar4 != 0x20);
          }
          XVar3 = XVar3 + 1;
        } while (XVar3 != pCVar1->fArraySize);
      }
    }
  }
  else {
LAB_002ea3ce:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool operator==(const CMStateSet& setToCompare) const
    {
        if (fBitCount != setToCompare.fBitCount)
            return false;

        if(fDynamicBuffer==0)
        {
            for (XMLSize_t index = 0; index < CMSTATE_CACHED_INT32_SIZE; index++)
            {
                if (fBits[index] != setToCompare.fBits[index])
                    return false;
            }
        }
        else
        {
            for (XMLSize_t index = 0; index < fDynamicBuffer->fArraySize; index++)
            {
                XMLInt32 *& other = setToCompare.fDynamicBuffer->fBitArray[index],
                         *& mine = fDynamicBuffer->fBitArray[index];
                if(mine==NULL && other==NULL)
                    continue;
                else if(mine==NULL || other==NULL) // the other should have been empty too
                    return false;
                else
                {
                    for(XMLSize_t subIndex = 0; subIndex < CMSTATE_BITFIELD_INT32_SIZE; subIndex++)
                        if(mine[subIndex]!=other[subIndex])
                            return false;
                }
            }
        }
        return true;
    }